

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> * __thiscall
kj::tryParseHttpMethodAllowingConnect
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *__return_storage_ptr__,kj *this
          ,StringPtr name)

{
  undefined1 local_40 [8];
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> result;
  char *ptr;
  StringPtr name_local;
  
  name_local.content.ptr = name.content.ptr;
  ptr = (char *)this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  result.ptr.field_1.value.field_1 =
       (anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2)
       StringPtr::begin((StringPtr *)&ptr);
  consumeHttpMethod((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_40,
                    (char **)&result.ptr.field_1.value.field_1);
  if (*(char *)result.ptr.field_1.value.field_1 == '\0') {
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
              (__return_storage_ptr__,
               (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_40);
  }
  else {
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
  }
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~Maybe
            ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>> tryParseHttpMethodAllowingConnect(
    kj::StringPtr name) {
  // const_cast OK because we don't actually access it. consumeHttpMethod() is also called by some
  // code later than explicitly needs to use a non-const pointer.
  char* ptr = const_cast<char*>(name.begin());
  auto result = consumeHttpMethod(ptr);
  if (*ptr == '\0') {
    return result;
  } else {
    return kj::none;
  }
}